

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer_next.cpp
# Opt level: O1

unique_ptr<pfederc::Token,_std::default_delete<pfederc::Token>_> __thiscall
pfederc::Lexer::generateError
          (Lexer *this,
          unique_ptr<pfederc::Error<pfederc::LexerErrorCode>,_std::default_delete<pfederc::Error<pfederc::LexerErrorCode>_>_>
          *err)

{
  uint uVar1;
  Token *this_00;
  unique_ptr<pfederc::Error<pfederc::LexerErrorCode>,_std::default_delete<pfederc::Error<pfederc::LexerErrorCode>_>_>
  *in_RDX;
  Position PStack_38;
  
  std::
  vector<std::unique_ptr<pfederc::Error<pfederc::LexerErrorCode>,std::default_delete<pfederc::Error<pfederc::LexerErrorCode>>>,std::allocator<std::unique_ptr<pfederc::Error<pfederc::LexerErrorCode>,std::default_delete<pfederc::Error<pfederc::LexerErrorCode>>>>>
  ::
  emplace_back<std::unique_ptr<pfederc::Error<pfederc::LexerErrorCode>,std::default_delete<pfederc::Error<pfederc::LexerErrorCode>>>>
            ((vector<std::unique_ptr<pfederc::Error<pfederc::LexerErrorCode>,std::default_delete<pfederc::Error<pfederc::LexerErrorCode>>>,std::allocator<std::unique_ptr<pfederc::Error<pfederc::LexerErrorCode>,std::default_delete<pfederc::Error<pfederc::LexerErrorCode>>>>>
              *)(err + 0x11),in_RDX);
  while ((uVar1 = *(int *)&err[0x16]._M_t.
                           super___uniq_ptr_impl<pfederc::Error<pfederc::LexerErrorCode>,_std::default_delete<pfederc::Error<pfederc::LexerErrorCode>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_pfederc::Error<pfederc::LexerErrorCode>_*,_std::default_delete<pfederc::Error<pfederc::LexerErrorCode>_>_>
                           .super__Head_base<0UL,_pfederc::Error<pfederc::LexerErrorCode>_*,_false>.
                           _M_head_impl + 1, 0xe < uVar1 || ((0x4801U >> (uVar1 & 0x1f) & 1) == 0)))
  {
    nextChar((Lexer *)err);
  }
  getCurrentCursor(&PStack_38,(Lexer *)err);
  this_00 = (Token *)operator_new(0x30);
  Token::Token(this_00,(Token *)err[0x17]._M_t.
                                super___uniq_ptr_impl<pfederc::Error<pfederc::LexerErrorCode>,_std::default_delete<pfederc::Error<pfederc::LexerErrorCode>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_pfederc::Error<pfederc::LexerErrorCode>_*,_std::default_delete<pfederc::Error<pfederc::LexerErrorCode>_>_>
                                .
                                super__Head_base<0UL,_pfederc::Error<pfederc::LexerErrorCode>_*,_false>
                                ._M_head_impl,TOK_ERR,&PStack_38);
  this->_vptr_Lexer = (_func_int **)this_00;
  return (__uniq_ptr_data<pfederc::Token,_std::default_delete<pfederc::Token>,_true,_true>)
         (__uniq_ptr_data<pfederc::Token,_std::default_delete<pfederc::Token>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Token> Lexer::generateError(std::unique_ptr<LexerError> &&err) noexcept {
  errors.push_back(std::move(err));
  while (currentChar != EOF
      && currentChar != '\n' && currentChar != '\r')
    nextChar();
  return std::make_unique<Token>(currentToken, TokenType::TOK_ERR, getCurrentCursor());
}